

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::DeadCodeEliminationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,DeadCodeEliminationCase *this,bool optimized)

{
  CaseShaderType CVar1;
  ProgramData *pPVar2;
  bool useConst;
  undefined8 *puVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  char *pcVar7;
  ulong *puVar8;
  undefined7 in_register_00000011;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBX;
  bool optimized_00;
  undefined8 *unaff_RBP;
  _Alloc_hider _Var9;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string statements;
  string precision;
  size_type __dnew_2;
  string funcDefs;
  size_type __dnew_1;
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  long local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  string local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  long local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  undefined8 local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [3];
  ios_base local_180 [264];
  string local_78;
  ProgramData *local_58;
  string local_50;
  
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  local_58 = __return_storage_ptr__;
  if (CASESHADERTYPE_FRAGMENT < CVar1) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
    goto switchD_006c80c2_default;
  }
  unaff_RBP = (undefined8 *)(CONCAT71(in_register_00000011,optimized) & 0xffffffff);
  local_270.field_2._M_local_buf[4] = 'p';
  local_270.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_270._M_string_length = 5;
  local_270.field_2._M_local_buf[5] = '\0';
  optimized_00 = SUB81(unaff_RBP,0);
  if (this->m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN) {
    iVar10 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar10 = 0xc;
    }
    if (optimized_00 == false) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_230,local_270._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_230);
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_270._M_dataplus._M_p)
      ;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      pcVar7 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7) {
        local_290.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
        local_290.field_2._8_8_ = puVar3[3];
      }
      else {
        local_290.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
        local_290._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_290._M_string_length = puVar3[1];
      *puVar3 = pcVar7;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_2b0.field_2._M_allocated_capacity = *puVar6;
        local_2b0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *puVar6;
        local_2b0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_2b0._M_string_length = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_270._M_dataplus._M_p)
      ;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_250.field_2._M_allocated_capacity = *puVar6;
        local_250.field_2._8_8_ = puVar3[3];
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar6;
        local_250._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_250._M_string_length = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_2d0 = &local_2c0;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_2c0._M_allocated_capacity = *puVar6;
        local_2c0._8_8_ = puVar3[3];
      }
      else {
        local_2c0._M_allocated_capacity = *puVar6;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar3;
      }
      local_2c8 = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270._M_dataplus._M_p)
      ;
      local_2f0 = &local_2e0;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_2e0._M_allocated_capacity = *puVar6;
        local_2e0._8_8_ = puVar3[3];
      }
      else {
        local_2e0._M_allocated_capacity = *puVar6;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar3;
      }
      local_2e8 = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_320._M_allocated_capacity = *puVar6;
        local_320._8_8_ = puVar3[3];
        local_330 = &local_320;
      }
      else {
        local_320._M_allocated_capacity = *puVar6;
        local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar3;
      }
      local_328 = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_50._M_dataplus._M_p = (pointer)0x26;
      local_78._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_50);
      local_78.field_2._M_allocated_capacity = (size_type)local_50._M_dataplus._M_p;
      builtin_strncpy(local_78._M_dataplus._M_p,"\tunused = sin(sin(sin(sin(unused))));\n",0x26);
      local_78._M_string_length = (size_type)local_50._M_dataplus._M_p;
      local_78._M_dataplus._M_p[(long)local_50._M_dataplus._M_p] = '\0';
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      repeat(&local_310,&local_78,iVar10,&local_50);
      uVar5 = (char *)0xf;
      if (local_330 != &local_320) {
        uVar5 = local_320._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (char *)(local_310._M_string_length + local_328)) {
        uVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          uVar5 = local_310.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < (char *)(local_310._M_string_length + local_328)) goto LAB_006c7e68;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_330);
      }
      else {
LAB_006c7e68:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_330,(ulong)local_310._M_dataplus._M_p);
      }
      local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_1f0[0].field_2._0_8_ = *puVar6;
        local_1f0[0].field_2._8_8_ = puVar3[3];
      }
      else {
        local_1f0[0].field_2._0_8_ = *puVar6;
        local_1f0[0]._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_1f0[0]._M_string_length = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)puVar6 = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_210.field_2._M_allocated_capacity = *puVar8;
        local_210.field_2._8_8_ = puVar3[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *puVar8;
        local_210._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_210._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
        operator_delete(local_1f0[0]._M_dataplus._M_p,
                        (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,
                        (ulong)(local_310.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        (ulong)(local_78.field_2._M_allocated_capacity + 1));
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
      }
      unaff_RBX = &local_230.field_2;
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,(ulong)(local_2c0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        (ulong)(local_250.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,
                        (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,
                        (ulong)(local_290.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p == unaff_RBX) goto LAB_006c80a3;
      uVar5 = (char *)CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]);
      _Var9._M_p = local_230._M_dataplus._M_p;
    }
    else {
      local_2d0 = &local_2c0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2d0,local_270._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_2d0);
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270._M_dataplus._M_p)
      ;
      local_2f0 = &local_2e0;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_2e0._M_allocated_capacity = *puVar6;
        local_2e0._8_8_ = puVar3[3];
      }
      else {
        local_2e0._M_allocated_capacity = *puVar6;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar3;
      }
      local_2e8 = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_320._M_allocated_capacity = *puVar6;
        local_320._8_8_ = puVar3[3];
        local_330 = &local_320;
      }
      else {
        local_320._M_allocated_capacity = *puVar6;
        local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar3;
      }
      local_328 = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_270._M_dataplus._M_p)
      ;
      unaff_RBX = &local_1f0[0].field_2;
      local_1f0[0]._M_dataplus._M_p = (pointer)*puVar3;
      puVar6 = puVar3 + 2;
      if (local_1f0[0]._M_dataplus._M_p == (pointer)puVar6) {
        local_1f0[0].field_2._0_8_ = *puVar6;
        local_1f0[0].field_2._8_8_ = puVar3[3];
        local_1f0[0]._M_dataplus._M_p = (pointer)unaff_RBX;
      }
      else {
        local_1f0[0].field_2._0_8_ = *puVar6;
      }
      local_1f0[0]._M_string_length = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_210.field_2._M_allocated_capacity = *puVar8;
        local_210.field_2._8_8_ = puVar3[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *puVar8;
        local_210._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_210._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0[0]._M_dataplus._M_p != unaff_RBX) {
        operator_delete(local_1f0[0]._M_dataplus._M_p,
                        (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
      }
      uVar5 = local_2c0._M_allocated_capacity;
      _Var9._M_p = (pointer)local_2d0;
      if (local_2d0 == &local_2c0) goto LAB_006c80a3;
    }
LAB_006c809b:
    operator_delete(_Var9._M_p,(ulong)(uVar5 + 1));
  }
  else if (this->m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL) {
    if (optimized_00 == false) {
      unaff_RBX = &local_320;
      local_330 = unaff_RBX;
      std::__cxx11::string::_M_construct<char*>((string *)&local_330,local_270._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_330);
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_270._M_dataplus._M_p)
      ;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_1f0[0].field_2._0_8_ = *puVar6;
        local_1f0[0].field_2._8_8_ = puVar3[3];
        local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
      }
      else {
        local_1f0[0].field_2._0_8_ = *puVar6;
        local_1f0[0]._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_1f0[0]._M_string_length = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_210.field_2._M_allocated_capacity = *puVar8;
        local_210.field_2._8_8_ = plVar4[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *puVar8;
        local_210._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_210._M_string_length = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
        operator_delete(local_1f0[0]._M_dataplus._M_p,
                        (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
      }
      uVar5 = local_320._M_allocated_capacity;
      _Var9._M_p = (pointer)local_330;
      if (local_330 != unaff_RBX) goto LAB_006c809b;
    }
    else {
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_allocated_capacity =
           local_210.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
  }
  else {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  }
LAB_006c80a3:
  switch(this->m_caseType) {
  case CASETYPE_DEAD_BRANCH_SIMPLE:
    if (optimized_00 == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      iVar10 = 4;
      if (CVar1 == CASESHADERTYPE_VERTEX) {
        iVar10 = 0x10;
      }
      std::ostream::operator<<(local_1f0,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base(local_180);
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0xb2b6a3)
      ;
      local_330 = &local_320;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_320._M_allocated_capacity = *puVar6;
        local_320._8_8_ = puVar3[3];
      }
      else {
        local_320._M_allocated_capacity = *puVar6;
        local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar3;
      }
      local_328 = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
LAB_006c8ae4:
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      pcVar7 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7) {
        local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
        local_310.field_2._8_8_ = puVar3[3];
      }
      else {
        local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
        local_310._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_310._M_string_length = puVar3[1];
      *puVar3 = pcVar7;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      if (local_330 != &local_320) {
        operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
      }
      uVar5 = local_2e0._M_allocated_capacity;
      _Var9._M_p = (pointer)local_2f0;
      if (local_2f0 == &local_2e0) goto LAB_006c9465;
      goto LAB_006c945d;
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    local_1f0[0]._M_dataplus._M_p = (pointer)0x2b;
    local_310._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)local_1f0);
    break;
  case CASETYPE_DEAD_BRANCH_COMPLEX:
    useConst = true;
    goto LAB_006c8216;
  case CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST:
    useConst = false;
LAB_006c8216:
    deadBranchComplexCaseStatements
              (&local_310,optimized_00,&local_270,useConst,CVar1 == CASESHADERTYPE_VERTEX);
    goto LAB_006c9465;
  case CASETYPE_DEAD_BRANCH_FUNC_CALL:
    if (optimized_00 == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      iVar10 = 4;
      if (CVar1 == CASESHADERTYPE_VERTEX) {
        iVar10 = 0x10;
      }
      std::ostream::operator<<(local_1f0,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base(local_180);
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0xb2b80b)
      ;
      local_330 = &local_320;
      puVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_320._M_allocated_capacity = *puVar6;
        local_320._8_8_ = puVar3[3];
      }
      else {
        local_320._M_allocated_capacity = *puVar6;
        local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar3;
      }
      local_328 = puVar3[1];
      *puVar3 = puVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
      goto LAB_006c8ae4;
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    local_1f0[0]._M_dataplus._M_p = (pointer)0x2b;
    local_310._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)local_1f0);
    break;
  case CASETYPE_UNUSED_VALUE_BASIC:
    iVar10 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar10 = 0xc;
    }
    if (optimized_00 != false) {
      std::operator+(local_1f0,"\t",&local_270);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
LAB_006c8326:
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      pcVar7 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7) {
        local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
        local_310.field_2._8_8_ = puVar3[3];
      }
      else {
        local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
        local_310._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_310._M_string_length = puVar3[1];
      *puVar3 = pcVar7;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      uVar5 = local_1f0[0].field_2._M_allocated_capacity;
      _Var9._M_p = local_1f0[0]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0[0]._M_dataplus._M_p == &local_1f0[0].field_2) goto LAB_006c9465;
      goto LAB_006c945d;
    }
    std::operator+(&local_250,"\t",&local_270);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    local_2d0 = &local_2c0;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_2c0._M_allocated_capacity = *puVar6;
      local_2c0._8_8_ = puVar3[3];
    }
    else {
      local_2c0._M_allocated_capacity = *puVar6;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_2c8 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270._M_dataplus._M_p);
    local_2f0 = &local_2e0;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_2e0._M_allocated_capacity = *puVar6;
      local_2e0._8_8_ = puVar3[3];
    }
    else {
      local_2e0._M_allocated_capacity = *puVar6;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_2e8 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_320._M_allocated_capacity = *puVar6;
      local_320._8_8_ = puVar3[3];
      local_330 = &local_320;
    }
    else {
      local_320._M_allocated_capacity = *puVar6;
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_328 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    local_230._M_dataplus._M_p = (char *)0x26;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    local_290._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_290,(ulong)&local_230);
    local_290.field_2._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x10) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x11) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x12) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x13) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x14) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x15) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x16) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x17) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x18) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x19) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1a) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1b) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1c) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1d) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1f) = 'd';
    *(undefined8 *)local_290._M_dataplus._M_p = 0x20646573756e7509;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 8) = '=';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 9) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xb) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1f) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x20) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x21) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x22) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x23) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x24) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x25) = '\n';
    local_290._M_string_length = (size_type)local_230._M_dataplus._M_p;
    local_290._M_dataplus._M_p[(long)local_230._M_dataplus._M_p] = '\0';
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    repeat(&local_2b0,&local_290,iVar10,&local_230);
    uVar5 = (char *)0xf;
    if (local_330 != &local_320) {
      uVar5 = local_320._M_allocated_capacity;
    }
    if ((ulong)uVar5 < (char *)(local_2b0._M_string_length + local_328)) {
      uVar5 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar5 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (char *)(local_2b0._M_string_length + local_328)) goto LAB_006c8a77;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_006c8a77:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_1f0[0].field_2._0_8_ = *puVar6;
      local_1f0[0].field_2._8_8_ = puVar3[3];
    }
    else {
      local_1f0[0].field_2._0_8_ = *puVar6;
      local_1f0[0]._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_1f0[0]._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    pcVar7 = (char *)(puVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar7) {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_310.field_2._8_8_ = puVar3[3];
    }
    else {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_310._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_310._M_string_length = puVar3[1];
    *puVar3 = pcVar7;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,
                      (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if (local_2f0 != &local_2e0) {
LAB_006c8fcf:
      operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
    }
    goto LAB_006c8fdc;
  case CASETYPE_UNUSED_VALUE_LOOP:
    iVar10 = 4;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar10 = 0x10;
    }
    if (optimized_00 != false) {
      std::operator+(local_1f0,"\t",&local_270);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      goto LAB_006c8326;
    }
    std::operator+(&local_2b0,"\t",&local_270);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_250.field_2._M_allocated_capacity = *puVar6;
      local_250.field_2._8_8_ = puVar3[3];
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *puVar6;
      local_250._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_250._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_270._M_dataplus._M_p);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_2c0._M_allocated_capacity = *puVar6;
      local_2c0._8_8_ = puVar3[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = *puVar6;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_2c8 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_2e0._M_allocated_capacity = *puVar6;
      local_2e0._8_8_ = puVar3[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_allocated_capacity = *puVar6;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_2e8 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::ostream::operator<<(local_1f0,iVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    std::ios_base::~ios_base(local_180);
    uVar5 = (char *)0xf;
    if (local_2f0 != &local_2e0) {
      uVar5 = local_2e0._M_allocated_capacity;
    }
    if ((ulong)uVar5 < (char *)(local_290._M_string_length + local_2e8)) {
      uVar5 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar5 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (char *)(local_290._M_string_length + local_2e8)) goto LAB_006c8c23;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2f0);
    }
    else {
LAB_006c8c23:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_330 = &local_320;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_320._M_allocated_capacity = *puVar6;
      local_320._8_8_ = puVar3[3];
    }
    else {
      local_320._M_allocated_capacity = *puVar6;
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_328 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    pcVar7 = (char *)(puVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar7) {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_310.field_2._8_8_ = puVar3[3];
    }
    else {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_310._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_310._M_string_length = puVar3[1];
    *puVar3 = pcVar7;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0,(ulong)(local_2c0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      (ulong)(local_250.field_2._M_allocated_capacity + 1));
    }
    uVar5 = local_2b0.field_2._M_allocated_capacity;
    _Var9._M_p = local_2b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == &local_2b0.field_2) goto LAB_006c9465;
    goto LAB_006c945d;
  case CASETYPE_UNUSED_VALUE_DEAD_BRANCH:
    iVar10 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar10 = 0xc;
    }
    if (optimized_00 != false) {
      std::operator+(local_1f0,"\t",&local_270);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      goto LAB_006c8326;
    }
    std::operator+(&local_250,"\t",&local_270);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    local_2d0 = &local_2c0;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_2c0._M_allocated_capacity = *puVar6;
      local_2c0._8_8_ = puVar3[3];
    }
    else {
      local_2c0._M_allocated_capacity = *puVar6;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_2c8 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270._M_dataplus._M_p);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_2e0._M_allocated_capacity = *puVar6;
      local_2e0._8_8_ = puVar3[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_allocated_capacity = *puVar6;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_2e8 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_320._M_allocated_capacity = *puVar6;
      local_320._8_8_ = puVar3[3];
      local_330 = &local_320;
    }
    else {
      local_320._M_allocated_capacity = *puVar6;
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_328 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    local_230._M_dataplus._M_p = (char *)0x26;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    local_290._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_290,(ulong)&local_230);
    local_290.field_2._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x10) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x11) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x12) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x13) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x14) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x15) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x16) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x17) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x18) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x19) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1a) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1b) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1c) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1d) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1f) = 'd';
    *(undefined8 *)local_290._M_dataplus._M_p = 0x20646573756e7509;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 8) = '=';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 9) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xb) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1f) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x20) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x21) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x22) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x23) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x24) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x25) = '\n';
    local_290._M_string_length = (size_type)local_230._M_dataplus._M_p;
    local_290._M_dataplus._M_p[(long)local_230._M_dataplus._M_p] = '\0';
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    repeat(&local_2b0,&local_290,iVar10,&local_230);
    uVar5 = (char *)0xf;
    if (local_330 != &local_320) {
      uVar5 = local_320._M_allocated_capacity;
    }
    if ((ulong)uVar5 < (char *)(local_2b0._M_string_length + local_328)) {
      uVar5 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar5 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (char *)(local_2b0._M_string_length + local_328)) goto LAB_006c8d3e;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_006c8d3e:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_1f0[0].field_2._0_8_ = *puVar6;
      local_1f0[0].field_2._8_8_ = puVar3[3];
    }
    else {
      local_1f0[0].field_2._0_8_ = *puVar6;
      local_1f0[0]._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_1f0[0]._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    pcVar7 = (char *)(puVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar7) {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_310.field_2._8_8_ = puVar3[3];
    }
    else {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_310._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_310._M_string_length = puVar3[1];
    *puVar3 = pcVar7;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,
                      (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
    }
    if (local_2d0 != &local_2c0) goto LAB_006c8fe6;
    goto LAB_006c8ff3;
  case CASETYPE_UNUSED_VALUE_AFTER_RETURN:
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    local_1f0[0]._M_dataplus._M_p = (pointer)0x16;
    local_310._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)local_1f0);
    *(undefined8 *)local_310._M_dataplus._M_p = 0x3d2065756c617609;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 8) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 9) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 10) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xb) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xc) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xe) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xf) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xe) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xf) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x10) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x11) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x12) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x13) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x14) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x15) = '\n';
    goto LAB_006c820b;
  case CASETYPE_UNUSED_VALUE_MUL_ZERO:
    iVar10 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar10 = 0xc;
    }
    if (optimized_00 != false) {
      std::operator+(local_1f0,"\t",&local_270);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      goto LAB_006c8326;
    }
    std::operator+(&local_250,"\t",&local_270);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    local_2d0 = &local_2c0;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_2c0._M_allocated_capacity = *puVar6;
      local_2c0._8_8_ = puVar3[3];
    }
    else {
      local_2c0._M_allocated_capacity = *puVar6;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_2c8 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270._M_dataplus._M_p);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_2e0._M_allocated_capacity = *puVar6;
      local_2e0._8_8_ = puVar3[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_allocated_capacity = *puVar6;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_2e8 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_320._M_allocated_capacity = *puVar6;
      local_320._8_8_ = puVar3[3];
      local_330 = &local_320;
    }
    else {
      local_320._M_allocated_capacity = *puVar6;
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3;
    }
    local_328 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    local_230._M_dataplus._M_p = (char *)0x26;
    local_290._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_290,(ulong)&local_230);
    local_290.field_2._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x10) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x11) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x12) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x13) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x14) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x15) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x16) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x17) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x18) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x19) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1a) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1b) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1c) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1d) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1f) = 'd';
    *(undefined8 *)local_290._M_dataplus._M_p = 0x20646573756e7509;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 8) = '=';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 9) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xb) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x1f) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x20) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x21) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x22) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x23) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x24) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p + 0x25) = '\n';
    local_290._M_string_length = (size_type)local_230._M_dataplus._M_p;
    local_290._M_dataplus._M_p[(long)local_230._M_dataplus._M_p] = '\0';
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    repeat(&local_2b0,&local_290,iVar10,&local_230);
    uVar5 = (char *)0xf;
    if (local_330 != &local_320) {
      uVar5 = local_320._M_allocated_capacity;
    }
    if ((ulong)uVar5 < (char *)(local_2b0._M_string_length + local_328)) {
      uVar5 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar5 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (char *)(local_2b0._M_string_length + local_328)) goto LAB_006c8e59;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_006c8e59:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_1f0[0].field_2._0_8_ = *puVar6;
      local_1f0[0].field_2._8_8_ = puVar3[3];
    }
    else {
      local_1f0[0].field_2._0_8_ = *puVar6;
      local_1f0[0]._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_1f0[0]._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    pcVar7 = (char *)(puVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar7) {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_310.field_2._8_8_ = puVar3[3];
    }
    else {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
      local_310._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_310._M_string_length = puVar3[1];
    *puVar3 = pcVar7;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,
                      (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if (local_2f0 != &local_2e0) goto LAB_006c8fcf;
LAB_006c8fdc:
    if (local_2d0 != &local_2c0) {
LAB_006c8fe6:
      operator_delete(local_2d0,(ulong)(local_2c0._M_allocated_capacity + 1));
    }
LAB_006c8ff3:
    uVar5 = local_250.field_2._M_allocated_capacity;
    _Var9._M_p = local_250._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
LAB_006c945d:
      operator_delete(_Var9._M_p,(ulong)(uVar5 + 1));
    }
    goto LAB_006c9465;
  default:
switchD_006c80c2_default:
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    uVar5 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2f0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)unaff_RBP) {
      operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
    }
    if (local_2d0 != unaff_RBX) {
      operator_delete(local_2d0,(ulong)(local_2c0._M_allocated_capacity + 1));
    }
    if (local_250._M_dataplus._M_p != (pointer)(ulong)CVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      (ulong)(local_250.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      CONCAT26(local_270.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_270.field_2._M_local_buf[5],
                                        CONCAT14(local_270.field_2._M_local_buf[4],
                                                 local_270.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar5);
  }
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1b) = ',';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1c) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1d) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1e) = '.';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1f) = '9';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x20) = ')';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x21) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x22) = '*';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x23) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x24) = 'v';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x25) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x26) = 'l';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x27) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x28) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x29) = ';';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x2a) = '\n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x10) = '6';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x11) = ',';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x12) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x13) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x14) = '.';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x15) = '7';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x16) = ',';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x17) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x18) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x19) = '.';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1a) = '8';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1b) = ',';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1c) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1d) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1e) = '.';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1f) = '9';
  *(undefined8 *)local_310._M_dataplus._M_p = 0x3d2065756c617609;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 8) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 9) = 'v';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 10) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xb) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xc) = '4';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xd) = '(';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xe) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xf) = '.';
LAB_006c820b:
  local_310._M_dataplus._M_p[(long)local_1f0[0]._M_dataplus._M_p] = '\0';
  local_310._M_string_length = (size_type)local_1f0[0]._M_dataplus._M_p;
  local_310.field_2._M_allocated_capacity = (size_type)local_1f0[0]._M_dataplus._M_p;
LAB_006c9465:
  pPVar2 = local_58;
  defaultProgramData(local_58,(this->super_ShaderOptimizationCase).m_caseShaderType,&local_210,
                     &local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,(ulong)(local_310.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT26(local_270.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_270.field_2._M_local_buf[5],
                                      CONCAT14(local_270.field_2._M_local_buf[4],
                                               local_270.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return pPVar2;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	funcDefs		= m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL		? deadBranchFuncCallCaseFuncDefs		(optimized, precision)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN	? unusedValueAfterReturnCaseFuncDefs	(optimized, precision, isVertexCase)
										: "";

		const string	statements		= m_caseType == CASETYPE_DEAD_BRANCH_SIMPLE				? deadBranchSimpleCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX			? deadBranchComplexCaseStatements			(optimized, precision, true,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? deadBranchComplexCaseStatements			(optimized, precision, false,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL			? deadBranchFuncCallCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_BASIC				? unusedValueBasicCaseStatements			(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_LOOP				? unusedValueLoopCaseStatements				(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? unusedValueDeadBranchCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN		? unusedValueAfterReturnCaseStatements		()
										: m_caseType == CASETYPE_UNUSED_VALUE_MUL_ZERO			? unusedValueMulZeroCaseStatements			(optimized, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, funcDefs, statements);
	}